

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O0

bool checkInterfacePropertyCompatibility<bool>
               (cmGeneratorTarget *tgt,string *p,string *config,char *defaultValue,CompatibleType t,
               bool *param_6)

{
  byte bVar1;
  pointer tgt_00;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_> *this;
  string *psVar5;
  reference ppcVar6;
  pointer genexInterpreter_00;
  ostream *poVar7;
  byte local_793;
  byte local_792;
  string local_780;
  string local_760;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_740;
  string local_720;
  undefined1 local_700 [8];
  ostringstream e_2;
  string local_588;
  pair<bool,_bool> local_562;
  undefined1 local_560 [6];
  pair<bool,_bool> consistent_2;
  undefined1 local_540 [8];
  ostringstream e_1;
  string local_3c8;
  pair<bool,_bool> local_3a2;
  undefined1 local_3a0 [6];
  pair<bool,_bool> consistent_1;
  undefined1 local_380 [8];
  ostringstream e;
  string local_208;
  pair<bool,_bool> local_1e2;
  undefined1 local_1e0 [6];
  pair<bool,_bool> consistent;
  undefined1 local_1c0 [8];
  string reportEntry;
  undefined1 local_198 [6];
  bool ifacePropContent;
  bool ifaceIsSet;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  propKeys;
  cmGeneratorTarget *theTarget;
  const_iterator __end1;
  const_iterator __begin1;
  vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_> *__range1;
  unique_ptr<cmGeneratorExpressionInterpreter,_std::default_delete<cmGeneratorExpressionInterpreter>_>
  local_158;
  unique_ptr<cmGeneratorExpressionInterpreter,_std::default_delete<cmGeneratorExpressionInterpreter>_>
  local_150;
  unique_ptr<cmGeneratorExpressionInterpreter,_std::default_delete<cmGeneratorExpressionInterpreter>_>
  genexInterpreter;
  string interfaceProperty;
  cmAlphaNum local_108;
  cmAlphaNum local_d8;
  undefined1 local_a8 [8];
  string report;
  bool propInitialized;
  vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_> *deps;
  bool impliedByUse;
  undefined1 local_60 [7];
  bool explicitlySet;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  headPropKeys;
  bool propContent;
  bool *param_5_local;
  CompatibleType t_local;
  char *defaultValue_local;
  string *config_local;
  string *p_local;
  cmGeneratorTarget *tgt_local;
  
  headPropKeys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ =
       getTypedProperty<bool>(tgt,p,(cmGeneratorExpressionInterpreter *)0x0);
  cmGeneratorTarget::GetPropertyKeys_abi_cxx11_
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_60,tgt);
  bVar2 = cm::
          contains<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                    ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_60,p);
  bVar3 = cmGeneratorTarget::IsNullImpliedByLinkLibraries(tgt,p);
  local_792 = 1;
  if (bVar3 == bVar2) {
    local_793 = 0;
    if (!bVar3) {
      local_793 = bVar2 ^ 0xff;
    }
    local_792 = local_793;
  }
  if ((local_792 & 1) == 0) {
    __assert_fail("(impliedByUse ^ explicitlySet) || (!impliedByUse && !explicitlySet)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmGeneratorTarget.cxx"
                  ,0x17f5,
                  "PropertyType checkInterfacePropertyCompatibility(const cmGeneratorTarget *, const std::string &, const std::string &, const char *, CompatibleType, PropertyType *) [PropertyType = bool]"
                 );
  }
  this = cmGeneratorTarget::GetLinkImplementationClosure(tgt,config);
  bVar4 = std::vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>::empty
                    (this);
  if (bVar4) {
    report.field_2._12_4_ = 1;
    bVar1 = headPropKeys.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_;
  }
  else {
    report.field_2._M_local_buf[0xb] = bVar2;
    cmAlphaNum::cmAlphaNum(&local_d8," * Target \"");
    psVar5 = cmGeneratorTarget::GetName_abi_cxx11_(tgt);
    cmAlphaNum::cmAlphaNum(&local_108,psVar5);
    cmStrCat<>((string *)local_a8,&local_d8,&local_108);
    if (bVar2) {
      std::__cxx11::string::operator+=((string *)local_a8,"\" has property content \"");
      valueAsString<bool>((string *)((long)&interfaceProperty.field_2 + 8),
                          (bool)(headPropKeys.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1));
      std::__cxx11::string::operator+=
                ((string *)local_a8,(string *)(interfaceProperty.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)(interfaceProperty.field_2._M_local_buf + 8));
      std::__cxx11::string::operator+=((string *)local_a8,"\"\n");
    }
    else if (bVar3) {
      std::__cxx11::string::operator+=((string *)local_a8,"\" property is implied by use.\n");
    }
    else {
      std::__cxx11::string::operator+=((string *)local_a8,"\" property not set.\n");
    }
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &genexInterpreter,"INTERFACE_",p);
    std::
    unique_ptr<cmGeneratorExpressionInterpreter,std::default_delete<cmGeneratorExpressionInterpreter>>
    ::unique_ptr<std::default_delete<cmGeneratorExpressionInterpreter>,void>
              ((unique_ptr<cmGeneratorExpressionInterpreter,std::default_delete<cmGeneratorExpressionInterpreter>>
                *)&local_150);
    bVar4 = std::operator==(p,"POSITION_INDEPENDENT_CODE");
    if (bVar4) {
      __range1 = (vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_> *)
                 cmGeneratorTarget::GetLocalGenerator(tgt);
      std::
      make_unique<cmGeneratorExpressionInterpreter,cmLocalGenerator*,std::__cxx11::string_const&,cmGeneratorTarget_const*&>
                ((cmLocalGenerator **)&local_158,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&__range1,
                 (cmGeneratorTarget **)config);
      std::
      unique_ptr<cmGeneratorExpressionInterpreter,_std::default_delete<cmGeneratorExpressionInterpreter>_>
      ::operator=(&local_150,&local_158);
      std::
      unique_ptr<cmGeneratorExpressionInterpreter,_std::default_delete<cmGeneratorExpressionInterpreter>_>
      ::~unique_ptr(&local_158);
    }
    __end1 = std::vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>::
             begin(this);
    theTarget = (cmGeneratorTarget *)
                std::vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>::
                end(this);
    while (bVar4 = __gnu_cxx::operator!=
                             (&__end1,(__normal_iterator<const_cmGeneratorTarget_*const_*,_std::vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>_>
                                       *)&theTarget), bVar4) {
      ppcVar6 = __gnu_cxx::
                __normal_iterator<const_cmGeneratorTarget_*const_*,_std::vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>_>
                ::operator*(&__end1);
      propKeys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)*ppcVar6;
      cmGeneratorTarget::GetPropertyKeys_abi_cxx11_
                ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_198,
                 (cmGeneratorTarget *)
                 propKeys.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
      reportEntry.field_2._M_local_buf[0xf] =
           cm::
           contains<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                     ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_198,
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      &genexInterpreter);
      tgt_00 = propKeys.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
      genexInterpreter_00 =
           std::
           unique_ptr<cmGeneratorExpressionInterpreter,_std::default_delete<cmGeneratorExpressionInterpreter>_>
           ::get(&local_150);
      reportEntry.field_2._M_local_buf[0xe] =
           getTypedProperty<bool>
                     ((cmGeneratorTarget *)tgt_00,(string *)&genexInterpreter,genexInterpreter_00);
      std::__cxx11::string::string((string *)local_1c0);
      if ((reportEntry.field_2._M_local_buf[0xf] & 1U) != 0) {
        std::__cxx11::string::operator+=((string *)local_1c0," * Target \"");
        psVar5 = cmGeneratorTarget::GetName_abi_cxx11_
                           ((cmGeneratorTarget *)
                            propKeys.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage);
        std::__cxx11::string::operator+=((string *)local_1c0,(string *)psVar5);
        std::__cxx11::string::operator+=((string *)local_1c0,"\" property value \"");
        valueAsString<bool>((string *)local_1e0,(bool)(reportEntry.field_2._M_local_buf[0xe] & 1));
        std::__cxx11::string::operator+=((string *)local_1c0,(string *)local_1e0);
        std::__cxx11::string::~string((string *)local_1e0);
        std::__cxx11::string::operator+=((string *)local_1c0,"\" ");
      }
      if (bVar2) {
        if ((reportEntry.field_2._M_local_buf[0xf] & 1U) == 0) {
          report.field_2._12_4_ = 3;
        }
        else {
          local_1e2 = consistentProperty<bool>
                                ((bool)(headPropKeys.
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1
                                       ),(bool)(reportEntry.field_2._M_local_buf[0xe] & 1),t);
          std::__cxx11::string::operator+=((string *)local_a8,(string *)local_1c0);
          compatibilityAgree_abi_cxx11_
                    (&local_208,t,
                     (headPropKeys.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1) !=
                     (local_1e2.second & 1U));
          std::__cxx11::string::operator+=((string *)local_a8,(string *)&local_208);
          std::__cxx11::string::~string((string *)&local_208);
          if (((ushort)local_1e2 & 1) == 0) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_380);
            poVar7 = std::operator<<((ostream *)local_380,"Property ");
            poVar7 = std::operator<<(poVar7,(string *)p);
            poVar7 = std::operator<<(poVar7," on target \"");
            psVar5 = cmGeneratorTarget::GetName_abi_cxx11_(tgt);
            poVar7 = std::operator<<(poVar7,(string *)psVar5);
            poVar7 = std::operator<<(poVar7,"\" does\nnot match the INTERFACE_");
            poVar7 = std::operator<<(poVar7,(string *)p);
            poVar7 = std::operator<<(poVar7," property requirement\nof dependency \"");
            psVar5 = cmGeneratorTarget::GetName_abi_cxx11_
                               ((cmGeneratorTarget *)
                                propKeys.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage);
            poVar7 = std::operator<<(poVar7,(string *)psVar5);
            std::operator<<(poVar7,"\".\n");
            std::__cxx11::ostringstream::str();
            cmSystemTools::Error((string *)local_3a0);
            std::__cxx11::string::~string((string *)local_3a0);
            report.field_2._12_4_ = 2;
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_380);
          }
          else {
            headPropKeys.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = local_1e2.second & 1;
            report.field_2._12_4_ = 3;
          }
        }
      }
      else if (bVar3) {
        headPropKeys.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ =
             impliedValue<bool>((bool)(headPropKeys.
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1)
                               );
        if ((reportEntry.field_2._M_local_buf[0xf] & 1U) == 0) {
          report.field_2._12_4_ = 3;
        }
        else {
          local_3a2 = consistentProperty<bool>
                                ((bool)headPropKeys.
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_,
                                 (bool)(reportEntry.field_2._M_local_buf[0xe] & 1),t);
          std::__cxx11::string::operator+=((string *)local_a8,(string *)local_1c0);
          compatibilityAgree_abi_cxx11_
                    (&local_3c8,t,
                     (headPropKeys.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1) !=
                     (local_3a2.second & 1U));
          std::__cxx11::string::operator+=((string *)local_a8,(string *)&local_3c8);
          std::__cxx11::string::~string((string *)&local_3c8);
          if (((ushort)local_3a2 & 1) == 0) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_540);
            poVar7 = std::operator<<((ostream *)local_540,"Property ");
            poVar7 = std::operator<<(poVar7,(string *)p);
            poVar7 = std::operator<<(poVar7," on target \"");
            psVar5 = cmGeneratorTarget::GetName_abi_cxx11_(tgt);
            poVar7 = std::operator<<(poVar7,(string *)psVar5);
            poVar7 = std::operator<<(poVar7,"\" is\nimplied to be ");
            poVar7 = std::operator<<(poVar7,defaultValue);
            poVar7 = std::operator<<(poVar7,
                                     " because it was used to determine the link libraries\nalready. The INTERFACE_"
                                    );
            poVar7 = std::operator<<(poVar7,(string *)p);
            poVar7 = std::operator<<(poVar7," property on\ndependency \"");
            psVar5 = cmGeneratorTarget::GetName_abi_cxx11_
                               ((cmGeneratorTarget *)
                                propKeys.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage);
            poVar7 = std::operator<<(poVar7,(string *)psVar5);
            std::operator<<(poVar7,"\" is in conflict.\n");
            std::__cxx11::ostringstream::str();
            cmSystemTools::Error((string *)local_560);
            std::__cxx11::string::~string((string *)local_560);
            report.field_2._12_4_ = 2;
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_540);
          }
          else {
            headPropKeys.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = local_3a2.second & 1;
            report.field_2._12_4_ = 3;
          }
        }
      }
      else if ((reportEntry.field_2._M_local_buf[0xf] & 1U) == 0) {
        report.field_2._12_4_ = 3;
      }
      else if ((report.field_2._M_local_buf[0xb] & 1U) == 0) {
        std::operator+(&local_740,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_1c0,"(Interface set)\n");
        std::__cxx11::string::operator+=((string *)local_a8,(string *)&local_740);
        std::__cxx11::string::~string((string *)&local_740);
        headPropKeys.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ =
             reportEntry.field_2._M_local_buf[0xe] & 1;
        report.field_2._M_local_buf[0xb] = '\x01';
        report.field_2._12_4_ = 0;
      }
      else {
        local_562 = consistentProperty<bool>
                              ((bool)(headPropKeys.
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1),
                               (bool)(reportEntry.field_2._M_local_buf[0xe] & 1),t);
        std::__cxx11::string::operator+=((string *)local_a8,(string *)local_1c0);
        compatibilityAgree_abi_cxx11_
                  (&local_588,t,
                   (headPropKeys.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1) !=
                   (local_562.second & 1U));
        std::__cxx11::string::operator+=((string *)local_a8,(string *)&local_588);
        std::__cxx11::string::~string((string *)&local_588);
        if (((ushort)local_562 & 1) == 0) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_700);
          poVar7 = std::operator<<((ostream *)local_700,"The INTERFACE_");
          poVar7 = std::operator<<(poVar7,(string *)p);
          poVar7 = std::operator<<(poVar7," property of \"");
          psVar5 = cmGeneratorTarget::GetName_abi_cxx11_
                             ((cmGeneratorTarget *)
                              propKeys.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
          poVar7 = std::operator<<(poVar7,(string *)psVar5);
          poVar7 = std::operator<<(poVar7,"\" does\nnot agree with the value of ");
          poVar7 = std::operator<<(poVar7,(string *)p);
          poVar7 = std::operator<<(poVar7," already determined\nfor \"");
          psVar5 = cmGeneratorTarget::GetName_abi_cxx11_(tgt);
          poVar7 = std::operator<<(poVar7,(string *)psVar5);
          std::operator<<(poVar7,"\".\n");
          std::__cxx11::ostringstream::str();
          cmSystemTools::Error(&local_720);
          std::__cxx11::string::~string((string *)&local_720);
          report.field_2._12_4_ = 2;
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_700);
        }
        else {
          headPropKeys.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = local_562.second & 1;
          report.field_2._12_4_ = 3;
        }
      }
      std::__cxx11::string::~string((string *)local_1c0);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_198);
      if ((report.field_2._12_4_ != 0) && (report.field_2._12_4_ == 2)) break;
      __gnu_cxx::
      __normal_iterator<const_cmGeneratorTarget_*const_*,_std::vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>_>
      ::operator++(&__end1);
    }
    valueAsString<bool>(&local_760,
                        (bool)(headPropKeys.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1));
    compatibilityType_abi_cxx11_(&local_780,t);
    cmGeneratorTarget::ReportPropertyOrigin(tgt,p,&local_760,(string *)local_a8,&local_780);
    std::__cxx11::string::~string((string *)&local_780);
    std::__cxx11::string::~string((string *)&local_760);
    bVar1 = headPropKeys.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_;
    report.field_2._12_4_ = 1;
    std::
    unique_ptr<cmGeneratorExpressionInterpreter,_std::default_delete<cmGeneratorExpressionInterpreter>_>
    ::~unique_ptr(&local_150);
    std::__cxx11::string::~string((string *)&genexInterpreter);
    std::__cxx11::string::~string((string *)local_a8);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_60);
  return (bool)(bVar1 & 1);
}

Assistant:

PropertyType checkInterfacePropertyCompatibility(cmGeneratorTarget const* tgt,
                                                 const std::string& p,
                                                 const std::string& config,
                                                 const char* defaultValue,
                                                 CompatibleType t,
                                                 PropertyType* /*unused*/)
{
  PropertyType propContent = getTypedProperty<PropertyType>(tgt, p);

  std::vector<std::string> headPropKeys = tgt->GetPropertyKeys();
  const bool explicitlySet = cm::contains(headPropKeys, p);

  const bool impliedByUse = tgt->IsNullImpliedByLinkLibraries(p);
  assert((impliedByUse ^ explicitlySet) || (!impliedByUse && !explicitlySet));

  std::vector<cmGeneratorTarget const*> const& deps =
    tgt->GetLinkImplementationClosure(config);

  if (deps.empty()) {
    return propContent;
  }
  bool propInitialized = explicitlySet;

  std::string report = cmStrCat(" * Target \"", tgt->GetName());
  if (explicitlySet) {
    report += "\" has property content \"";
    report += valueAsString<PropertyType>(propContent);
    report += "\"\n";
  } else if (impliedByUse) {
    report += "\" property is implied by use.\n";
  } else {
    report += "\" property not set.\n";
  }

  std::string interfaceProperty = "INTERFACE_" + p;
  std::unique_ptr<cmGeneratorExpressionInterpreter> genexInterpreter;
  if (p == "POSITION_INDEPENDENT_CODE") {
    genexInterpreter = cm::make_unique<cmGeneratorExpressionInterpreter>(
      tgt->GetLocalGenerator(), config, tgt);
  }

  for (cmGeneratorTarget const* theTarget : deps) {
    // An error should be reported if one dependency
    // has INTERFACE_POSITION_INDEPENDENT_CODE ON and the other
    // has INTERFACE_POSITION_INDEPENDENT_CODE OFF, or if the
    // target itself has a POSITION_INDEPENDENT_CODE which disagrees
    // with a dependency.

    std::vector<std::string> propKeys = theTarget->GetPropertyKeys();

    const bool ifaceIsSet = cm::contains(propKeys, interfaceProperty);
    PropertyType ifacePropContent = getTypedProperty<PropertyType>(
      theTarget, interfaceProperty, genexInterpreter.get());

    std::string reportEntry;
    if (ifaceIsSet) {
      reportEntry += " * Target \"";
      reportEntry += theTarget->GetName();
      reportEntry += "\" property value \"";
      reportEntry += valueAsString<PropertyType>(ifacePropContent);
      reportEntry += "\" ";
    }

    if (explicitlySet) {
      if (ifaceIsSet) {
        std::pair<bool, PropertyType> consistent =
          consistentProperty(propContent, ifacePropContent, t);
        report += reportEntry;
        report += compatibilityAgree(t, propContent != consistent.second);
        if (!consistent.first) {
          std::ostringstream e;
          e << "Property " << p << " on target \"" << tgt->GetName()
            << "\" does\nnot match the "
               "INTERFACE_"
            << p
            << " property requirement\nof "
               "dependency \""
            << theTarget->GetName() << "\".\n";
          cmSystemTools::Error(e.str());
          break;
        }
        propContent = consistent.second;
        continue;
      }
      // Explicitly set on target and not set in iface. Can't disagree.
      continue;
    }
    if (impliedByUse) {
      propContent = impliedValue<PropertyType>(propContent);

      if (ifaceIsSet) {
        std::pair<bool, PropertyType> consistent =
          consistentProperty(propContent, ifacePropContent, t);
        report += reportEntry;
        report += compatibilityAgree(t, propContent != consistent.second);
        if (!consistent.first) {
          std::ostringstream e;
          e << "Property " << p << " on target \"" << tgt->GetName()
            << "\" is\nimplied to be " << defaultValue
            << " because it was used to determine the link libraries\n"
               "already. The INTERFACE_"
            << p << " property on\ndependency \"" << theTarget->GetName()
            << "\" is in conflict.\n";
          cmSystemTools::Error(e.str());
          break;
        }
        propContent = consistent.second;
        continue;
      }
      // Implicitly set on target and not set in iface. Can't disagree.
      continue;
    }
    if (ifaceIsSet) {
      if (propInitialized) {
        std::pair<bool, PropertyType> consistent =
          consistentProperty(propContent, ifacePropContent, t);
        report += reportEntry;
        report += compatibilityAgree(t, propContent != consistent.second);
        if (!consistent.first) {
          std::ostringstream e;
          e << "The INTERFACE_" << p << " property of \""
            << theTarget->GetName() << "\" does\nnot agree with the value of "
            << p << " already determined\nfor \"" << tgt->GetName() << "\".\n";
          cmSystemTools::Error(e.str());
          break;
        }
        propContent = consistent.second;
        continue;
      }
      report += reportEntry + "(Interface set)\n";
      propContent = ifacePropContent;
      propInitialized = true;
    } else {
      // Not set. Nothing to agree on.
      continue;
    }
  }

  tgt->ReportPropertyOrigin(p, valueAsString<PropertyType>(propContent),
                            report, compatibilityType(t));
  return propContent;
}